

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawDoubleSky1PalCommand::Execute(DrawDoubleSky1PalCommand *this,DrawerThread *thread)

{
  int pitch_00;
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uchar *dest_00;
  uint8_t *puVar12;
  uint8_t *puVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int c_blue;
  int c_green;
  int c_red;
  PalEntry *c;
  int inv_alpha_bottom;
  int inv_alpha_top;
  int alpha_bottom;
  int alpha_top;
  uint32_t sample_index2;
  int iStack_6c;
  uint8_t fg;
  uint32_t sample_index;
  int index;
  int skipped;
  int solid_bottom_b;
  int solid_bottom_g;
  int solid_bottom_r;
  int solid_top_b;
  int solid_top_g;
  int solid_top_r;
  int start_fade;
  int32_t fracstep;
  int32_t frac;
  uint32_t maxtextureheight1;
  int textureheight0;
  uint8_t *source1;
  uint8_t *source0;
  int pitch;
  int count;
  uint8_t *dest;
  DrawerThread *thread_local;
  DrawDoubleSky1PalCommand *this_local;
  
  dest_00 = (this->super_PalSkyCommand)._dest;
  pitch_00 = (this->super_PalSkyCommand)._pitch;
  puVar12 = (this->super_PalSkyCommand)._source[0];
  puVar13 = (this->super_PalSkyCommand)._source2[0];
  iVar1 = (this->super_PalSkyCommand)._sourceheight[0];
  iVar2 = (this->super_PalSkyCommand)._sourceheight[1];
  uVar3 = (this->super_PalSkyCommand)._texturefrac[0];
  uVar4 = (this->super_PalSkyCommand)._iscale[0];
  uVar5 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  uVar6 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  uVar7 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  uVar8 = (this->super_PalSkyCommand).solid_bottom;
  uVar9 = (this->super_PalSkyCommand).solid_bottom;
  uVar10 = (this->super_PalSkyCommand).solid_bottom;
  iVar14 = DrawerThread::count_for_thread
                     (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y,
                      (this->super_PalSkyCommand)._count);
  if (0 < iVar14) {
    iVar15 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y);
    _pitch = DrawerThread::dest_for_thread<unsigned_char>
                       (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y,pitch_00,
                        dest_00);
    start_fade = uVar4 * iVar15 + uVar3;
    iVar15 = thread->num_cores;
    iVar11 = thread->num_cores;
    for (iStack_6c = 0; iStack_6c < iVar14; iStack_6c = iStack_6c + 1) {
      uVar16 = ((uint)(start_fade << 8) >> 0x10) * iVar1 >> 0x10;
      alpha_top._3_1_ = puVar12[uVar16];
      if (alpha_top._3_1_ == 0) {
        uVar16 = MIN<unsigned_int>(uVar16,iVar2 - 1);
        alpha_top._3_1_ = puVar13[uVar16];
      }
      iVar17 = MIN<int>(start_fade >> 0xe,0x100);
      iVar17 = MAX<int>(iVar17,0);
      iVar18 = MIN<int>(0x2000000 - start_fade >> 0xe,0x100);
      iVar18 = MAX<int>(iVar18,0);
      if ((iVar17 == 0x100) && (iVar18 == 0x100)) {
        *_pitch = alpha_top._3_1_;
      }
      else {
        iVar19 = 0x100 - iVar17;
        iVar20 = 0x100 - iVar18;
        uVar21 = (ulong)alpha_top._3_1_;
        *_pitch = RGB32k.All
                  [(long)((int)(((int)((uint)GPalette.BaseColors[uVar21].field_0.field_0.b * iVar17
                                      + (uVar7 & 0xff) * iVar19) >> 8) * iVar18 +
                               (uVar10 & 0xff) * iVar20) >> 0xb) +
                   (long)((int)(((int)((uint)GPalette.BaseColors[uVar21].field_0.field_0.g * iVar17
                                      + (uVar6 >> 8 & 0xff) * iVar19) >> 8) * iVar18 +
                               (uVar9 >> 8 & 0xff) * iVar20) >> 0xb) * 0x20 +
                   (long)((int)(((int)((uint)GPalette.BaseColors[uVar21].field_0.field_0.r * iVar17
                                      + (uVar5 >> 0x10 & 0xff) * iVar19) >> 8) * iVar18 +
                               (uVar8 >> 0x10 & 0xff) * iVar20) >> 0xb) * 0x400];
      }
      start_fade = iVar15 * uVar4 + start_fade;
      _pitch = _pitch + iVar11 * pitch_00;
    }
  }
  return;
}

Assistant:

void DrawDoubleSky1PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0 = _source[0];
		const uint8_t *source1 = _source2[0];
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;

		int32_t frac = _texturefrac[0];
		int32_t fracstep = _iscale[0];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * skipped;
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		for (int index = 0; index < count; index++)
		{
			uint32_t sample_index = (((((uint32_t)frac) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
			uint8_t fg = source0[sample_index];
			if (fg == 0)
			{
				uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
				fg = source1[sample_index2];
			}

			int alpha_top = MAX(MIN(frac >> (16 - start_fade), 256), 0);
			int alpha_bottom = MAX(MIN(((2 << 24) - frac) >> (16 - start_fade), 256), 0);

			if (alpha_top == 256 && alpha_bottom == 256)
			{
				*dest = fg;
			}
			else
			{
				int inv_alpha_top = 256 - alpha_top;
				int inv_alpha_bottom = 256 - alpha_bottom;

				const auto &c = GPalette.BaseColors[fg];
				int c_red = c.r;
				int c_green = c.g;
				int c_blue = c.b;
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				*dest = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];
			}

			frac += fracstep;
			dest += pitch;
		}
	}